

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rp.cpp
# Opt level: O0

void compute_repair(string *in)

{
  cpair ab_00;
  ll_el<unsigned_int,_unsigned_int> el_00;
  value_type vVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  itype iVar5;
  uint uVar6;
  streamoff sVar7;
  ostream *poVar8;
  long *plVar9;
  reference pvVar10;
  lf_queue<ll_el<unsigned_int,_unsigned_int>_> *this;
  lf_queue<ll_el<unsigned_int,_unsigned_int>_> *Q;
  TP_t *TP_00;
  text_t *T_00;
  string *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 auVar11 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar14 [16];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  itype i_2;
  int perc_1;
  uint64_t f_2;
  uint64_t tl;
  pair<unsigned_int,_unsigned_int> replaced;
  el_t el;
  itype F_ab;
  itype L_ab;
  itype P_ab;
  cpair ab;
  uint64_t i_1;
  lf_q_t LFQ;
  uint64_t i;
  uint64_t f;
  uint64_t n_lf_pairs;
  int perc;
  uint64_t f_1;
  uint64_t F;
  int last_perc;
  hf_q_t HFQ;
  TP_t TP;
  char c;
  itype j;
  text_t T;
  itype max_d;
  itype width;
  ifstream file;
  vector<unsigned_int,_std::allocator<unsigned_int>_> char_to_int;
  ifstream ifs;
  itype null;
  itype lf_queue_capacity;
  itype min_high_frequency;
  itype sigma;
  itype n;
  uint64_t B;
  double alpha;
  pair<unsigned_int,_unsigned_int> *in_stack_fffffffffffff588;
  lf_queue<ll_el<unsigned_int,_unsigned_int>_> *in_stack_fffffffffffff590;
  uint in_stack_fffffffffffff598;
  uint in_stack_fffffffffffff59c;
  uint in_stack_fffffffffffff5a0;
  uint in_stack_fffffffffffff5a4;
  undefined4 in_stack_fffffffffffff5a8;
  undefined4 in_stack_fffffffffffff5ac;
  hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *in_stack_fffffffffffff5b0
  ;
  hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *in_stack_fffffffffffff5c8
  ;
  lf_queue<ll_el<unsigned_int,_unsigned_int>_> *in_stack_fffffffffffff5e0;
  undefined8 in_stack_fffffffffffff5f0;
  undefined8 in_stack_fffffffffffff5f8;
  uint in_stack_fffffffffffff600;
  undefined7 in_stack_fffffffffffff620;
  undefined1 in_stack_fffffffffffff627;
  cpair in_stack_fffffffffffff628;
  undefined4 in_stack_fffffffffffff678;
  uint in_stack_fffffffffffff67c;
  text_t *in_stack_fffffffffffff680;
  ulong uVar17;
  undefined4 in_stack_fffffffffffff688;
  undefined4 in_stack_fffffffffffff68c;
  hf_q_t *in_stack_fffffffffffff690;
  TP_t *in_stack_fffffffffffff698;
  hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *in_stack_fffffffffffff6a0
  ;
  undefined8 in_stack_fffffffffffff730;
  skippable_text<unsigned_int,_unsigned_int> *in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff744;
  uint local_7ac;
  uint local_770;
  int local_748 [2];
  pair<unsigned_int,_unsigned_int> local_740;
  pair<unsigned_int,_unsigned_int> *local_738;
  lf_queue<ll_el<unsigned_int,_unsigned_int>_> *plStack_730;
  uint local_728;
  cpair local_720;
  pair<unsigned_int,_unsigned_int> *local_718;
  lf_queue<ll_el<unsigned_int,_unsigned_int>_> *plStack_710;
  uint local_708;
  int local_704;
  int local_700;
  int local_6fc;
  cpair local_6f8;
  cpair local_6f0;
  cpair local_6e8;
  ulong local_6e0;
  lf_queue<ll_el<unsigned_int,_unsigned_int>_> local_6d8;
  cpair local_600;
  cpair local_5f8;
  ulong local_5f0;
  ulong local_5e8;
  ulong local_5e0;
  int local_5d4;
  uint64_t local_5d0;
  cpair local_5c8;
  cpair local_5c0;
  uint64_t local_5b8;
  int local_5ac;
  hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> local_5a8;
  uint local_4f4;
  byte local_4ed;
  int local_4ec;
  skippable_text<unsigned_int,_unsigned_int> local_4e8;
  int local_488;
  int local_484;
  fpos local_480 [16];
  undefined1 local_470 [544];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_250;
  char local_238 [524];
  undefined4 local_2c;
  undefined4 local_28;
  uint local_24;
  value_type local_20;
  uint local_1c;
  undefined8 local_18;
  undefined8 local_10;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  
  local_10 = 0x3fe51eb851eb851f;
  local_18 = 0x32;
  local_20 = 0;
  local_24 = 0;
  local_28 = 0;
  local_2c = 0xffffffff;
  std::ifstream::ifstream(local_238,in_RDI,_S_in);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x120c4b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff5b0,
             CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
             (value_type *)CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0),
             (allocator_type *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x120c7c);
  std::ifstream::ifstream(local_470,in_RDI,_S_ate);
  local_480 = (fpos  [16])std::istream::tellg();
  sVar7 = std::fpos::operator_cast_to_long(local_480);
  local_1c = (uint)sVar7;
  std::ifstream::~ifstream(local_470);
  auVar11._0_8_ =
       std::pow<unsigned_int,double>
                 ((uint)((ulong)in_stack_fffffffffffff590 >> 0x20),(double)in_stack_fffffffffffff588
                 );
  auVar11._8_8_ = 0;
  local_7ac = vcvttsd2usi_avx512f(auVar11);
  if (local_7ac < 2) {
    local_7ac = 2;
  }
  local_24 = local_7ac;
  poVar8 = std::operator<<((ostream *)&std::cout,"File size = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_1c);
  poVar8 = std::operator<<(poVar8," characters");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,"cut-off frequency = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_24);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  local_484 = 0x40 - (int)LZCOUNT((ulong)local_1c);
  local_488 = local_1c / local_24 + 0x100;
  skippable_text<unsigned_int,_unsigned_int>::skippable_text
            (in_stack_fffffffffffff680,in_stack_fffffffffffff67c);
  local_4ec = 0;
  poVar8 = std::operator<<((ostream *)&std::cout,"filling skippable text with text characters ... ")
  ;
  std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
  while( true ) {
    plVar9 = (long *)std::istream::get(local_238);
    bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar9 + *(long *)(*plVar9 + -0x18)));
    uVar3 = (uint)((ulong)in_stack_fffffffffffff730 >> 0x20);
    if (!bVar2) break;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&local_250,(ulong)local_4ed);
    vVar1 = local_20;
    if (*pvVar10 == 0xffffffff) {
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&local_250,(ulong)local_4ed);
      *pvVar10 = vVar1;
      local_4f4 = (uint)local_4ed;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff590,
                 &in_stack_fffffffffffff588->first);
      local_20 = local_20 + 1;
    }
    local_4ec = local_4ec + 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&local_250,(ulong)local_4ed);
    skippable_text<unsigned_int,_unsigned_int>::set
              ((skippable_text<unsigned_int,_unsigned_int> *)
               CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0),
               in_stack_fffffffffffff59c,in_stack_fffffffffffff598);
  }
  poVar8 = std::operator<<((ostream *)&std::cout,"done. ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,"alphabet size is ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_20);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "initializing and sorting text positions vector ... ");
  std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
  text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::text_positions
            ((text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),in_stack_fffffffffffff738
             ,uVar3);
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "done. Number of text positions containing a high-frequency pair: ");
  uVar3 = text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::size
                    ((text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>
                      *)0x12119d);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar3);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  X = local_20;
  poVar8 = std::operator<<((ostream *)&std::cout,"\nSTEP 1. HIGH FREQUENCY PAIRS");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,"inserting pairs in high-frequency queue ... ");
  std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
  hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::hf_queue
            (in_stack_fffffffffffff5b0);
  new_high_frequency_queue
            (in_stack_fffffffffffff690,
             (TP_t *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
             in_stack_fffffffffffff680,CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678)
            );
  poVar8 = std::operator<<((ostream *)&std::cout,"done. Number of distinct high-frequency pairs = ")
  ;
  uVar3 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::size(&local_5a8);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar3);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,"Replacing high-frequency pairs ... ");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  local_5ac = -1;
  local_5b8 = 0;
  while( true ) {
    local_5c0 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::max
                          (in_stack_fffffffffffff5c8);
    local_5c8 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::nullpair
                          (&local_5a8);
    bVar2 = std::operator!=((pair<unsigned_int,_unsigned_int> *)in_stack_fffffffffffff590,
                            in_stack_fffffffffffff588);
    if (!bVar2) break;
    local_5d0 = substitution_round<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
                          (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                           (text_t *)in_stack_fffffffffffff690);
    if (local_5ac == -1) {
      local_5ac = 0;
      local_5b8 = local_5d0;
    }
    else {
      local_5d4 = 100 - (int)((local_5d0 * 100) / local_5b8);
      if (local_5ac + 4 < local_5d4) {
        local_5ac = local_5d4;
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_5d4);
        poVar8 = std::operator<<(poVar8,"%");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  poVar8 = std::operator<<((ostream *)&std::cout,"done. ");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,"Peak queue size = ");
  uVar3 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::peak(&local_5a8);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar3);
  auVar15._8_56_ = extraout_var_01;
  auVar15._0_8_ = extraout_XMM1_Qa;
  auVar14 = auVar15._0_16_;
  auVar12._8_56_ = extraout_var;
  auVar12._0_8_ = extraout_XMM0_Qa;
  auVar11 = auVar12._0_16_;
  poVar8 = std::operator<<(poVar8," (");
  uVar3 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::peak(&local_5a8);
  auVar11 = vcvtusi2sd_avx512f(auVar11,uVar3);
  auVar14 = vcvtusi2sd_avx512f(auVar14,local_1c);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,auVar11._0_8_ / auVar14._0_8_);
  poVar8 = std::operator<<(poVar8,"n)");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,"\nSTEP 2. LOW FREQUENCY PAIRS");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,"Re-computing TP array ... ");
  std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
  text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::
  fill_with_text_positions
            ((text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_> *)
             CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620));
  poVar8 = std::operator<<((ostream *)&std::cout,"done.");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,"Sorting  TP array ... ");
  std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
  text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::cluster
            ((text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_> *)
             in_stack_fffffffffffff590);
  poVar8 = std::operator<<((ostream *)&std::cout,"done.");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  this = (lf_queue<ll_el<unsigned_int,_unsigned_int>_> *)
         std::operator<<((ostream *)&std::cout,"Counting low-frequency pairs ... ");
  std::ostream::operator<<((ostream *)this,std::flush<char,std::char_traits<char>>);
  local_5e0 = 0;
  local_5e8 = 1;
  local_5f0 = 1;
  while( true ) {
    uVar17 = local_5f0;
    uVar3 = text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::size
                      ((text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>
                        *)0x1217d4);
    if (uVar3 <= uVar17) break;
    text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::operator[]
              ((text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_> *)
               in_stack_fffffffffffff590,(uint)((ulong)in_stack_fffffffffffff588 >> 0x20));
    local_5f8 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                          ((skippable_text<unsigned_int,_unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                           in_stack_fffffffffffff5a4);
    text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::operator[]
              ((text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_> *)
               in_stack_fffffffffffff590,(uint)((ulong)in_stack_fffffffffffff588 >> 0x20));
    local_600 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                          ((skippable_text<unsigned_int,_unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                           in_stack_fffffffffffff5a4);
    bVar2 = std::operator==(&local_5f8,&local_600);
    if (bVar2) {
      local_5e8 = local_5e8 + 1;
    }
    else {
      local_5e8 = 1;
      local_5e0 = local_5e0 + 1;
    }
    local_5f0 = local_5f0 + 1;
  }
  Q = (lf_queue<ll_el<unsigned_int,_unsigned_int>_> *)
      std::operator<<((ostream *)&std::cout,"done. Number of distict low-frequency pairs: ");
  TP_00 = (TP_t *)std::ostream::operator<<((ostream *)Q,local_5e0);
  std::ostream::operator<<((ostream *)TP_00,std::endl<char,std::char_traits<char>>);
  T_00 = (text_t *)std::operator<<((ostream *)&std::cout,"Filling low-frequency queue ... ");
  std::ostream::operator<<((ostream *)T_00,std::flush<char,std::char_traits<char>>);
  lf_queue<ll_el<unsigned_int,_unsigned_int>_>::lf_queue(this,uVar3);
  local_5e8 = 1;
  local_6e0 = 1;
  while( true ) {
    uVar17 = local_6e0;
    uVar3 = text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::size
                      ((text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>
                        *)0x1219dd);
    if (uVar3 <= uVar17) break;
    text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::operator[]
              ((text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_> *)
               in_stack_fffffffffffff590,(uint)((ulong)in_stack_fffffffffffff588 >> 0x20));
    local_6e8 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                          ((skippable_text<unsigned_int,_unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                           in_stack_fffffffffffff5a4);
    text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::operator[]
              ((text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_> *)
               in_stack_fffffffffffff590,(uint)((ulong)in_stack_fffffffffffff588 >> 0x20));
    local_6f0 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                          ((skippable_text<unsigned_int,_unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                           in_stack_fffffffffffff5a4);
    bVar2 = std::operator==(&local_6e8,&local_6f0);
    if (bVar2) {
      local_5e8 = local_5e8 + 1;
    }
    else {
      if (1 < local_5e8) {
        text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::operator[]
                  ((text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_> *
                   )in_stack_fffffffffffff590,(uint)((ulong)in_stack_fffffffffffff588 >> 0x20));
        uVar3 = (uint)((ulong)in_stack_fffffffffffff588 >> 0x20);
        local_720 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                              ((skippable_text<unsigned_int,_unsigned_int> *)
                               CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                               in_stack_fffffffffffff5a4);
        local_6fc = (int)local_6e0 - (int)local_5e8;
        local_700 = (int)local_5e8;
        local_704 = (int)local_5e8;
        ab_00.second = in_stack_fffffffffffff5a4;
        ab_00.first = in_stack_fffffffffffff5a0;
        local_6f8 = local_720;
        ll_el<unsigned_int,_unsigned_int>::ll_el
                  ((ll_el<unsigned_int,_unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),ab_00,
                   (uint)((ulong)in_stack_fffffffffffff590 >> 0x20),(uint)in_stack_fffffffffffff590,
                   uVar3);
        local_728 = local_708;
        local_738 = local_718;
        plStack_730 = plStack_710;
        el_00.P_ab = (int)in_stack_fffffffffffff5f8;
        el_00.L_ab = (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20);
        el_00.ab.first = (int)in_stack_fffffffffffff5f0;
        el_00.ab.second = (int)((ulong)in_stack_fffffffffffff5f0 >> 0x20);
        el_00.F_ab = in_stack_fffffffffffff600;
        in_stack_fffffffffffff588 = local_718;
        in_stack_fffffffffffff590 = plStack_710;
        in_stack_fffffffffffff598 = local_708;
        lf_queue<ll_el<unsigned_int,_unsigned_int>_>::insert(in_stack_fffffffffffff5e0,el_00);
      }
      local_5e8 = 1;
    }
    local_6e0 = local_6e0 + 1;
  }
  poVar8 = std::operator<<((ostream *)&std::cout,"done.");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,"Replacing low-frequency pairs ... ");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  local_748[1] = 0;
  local_748[0] = 0;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_740,local_748 + 1,local_748);
  local_5ac = -1;
  uVar3 = skippable_text<unsigned_int,_unsigned_int>::number_of_non_blank_characters(&local_4e8);
  while( true ) {
    lf_queue<ll_el<unsigned_int,_unsigned_int>_>::max
              ((lf_queue<ll_el<unsigned_int,_unsigned_int>_> *)in_stack_fffffffffffff628);
    in_stack_fffffffffffff628 = lf_queue<ll_el<unsigned_int,_unsigned_int>_>::nullpair(&local_6d8);
    bVar2 = std::operator!=((pair<unsigned_int,_unsigned_int> *)in_stack_fffffffffffff590,
                            in_stack_fffffffffffff588);
    if (!bVar2) break;
    substitution_round<lf_queue<ll_el<unsigned_int,unsigned_int>>>(Q,TP_00,T_00);
    uVar6 = skippable_text<unsigned_int,_unsigned_int>::number_of_non_blank_characters(&local_4e8);
    iVar4 = 100 - (uVar6 * 100) / uVar3;
    if (local_5ac + 4 < iVar4) {
      local_5ac = iVar4;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
      poVar8 = std::operator<<(poVar8,"%");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
  }
  poVar8 = std::operator<<((ostream *)&std::cout,"done. ");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,"Peak queue size = ");
  iVar5 = lf_queue<ll_el<unsigned_int,_unsigned_int>_>::peak(&local_6d8);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
  auVar16._8_56_ = extraout_var_02;
  auVar16._0_8_ = extraout_XMM1_Qa_00;
  auVar14 = auVar16._0_16_;
  auVar13._8_56_ = extraout_var_00;
  auVar13._0_8_ = extraout_XMM0_Qa_00;
  auVar11 = auVar13._0_16_;
  poVar8 = std::operator<<(poVar8," (");
  iVar5 = lf_queue<ll_el<unsigned_int,_unsigned_int>_>::peak(&local_6d8);
  auVar11 = vcvtusi2sd_avx512f(auVar11,iVar5);
  auVar14 = vcvtusi2sd_avx512f(auVar14,local_1c);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,auVar11._0_8_ / auVar14._0_8_);
  poVar8 = std::operator<<(poVar8,"n)");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,"Compressing grammar and storing it to file ... ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  local_770 = 0;
  while( true ) {
    uVar3 = local_770;
    uVar6 = skippable_text<unsigned_int,_unsigned_int>::size(&local_4e8);
    if (uVar6 <= uVar3) break;
    bVar2 = skippable_text<unsigned_int,_unsigned_int>::is_blank
                      ((skippable_text<unsigned_int,_unsigned_int> *)in_stack_fffffffffffff590,
                       (uint)((ulong)in_stack_fffffffffffff588 >> 0x20));
    in_stack_fffffffffffff5a4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff5a4);
    if (!bVar2) {
      in_stack_fffffffffffff5a0 =
           skippable_text<unsigned_int,_unsigned_int>::operator[]
                     ((skippable_text<unsigned_int,_unsigned_int> *)in_stack_fffffffffffff590,
                      (uint)((ulong)in_stack_fffffffffffff588 >> 0x20));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff590,
                 &in_stack_fffffffffffff588->first);
    }
    local_770 = local_770 + 1;
  }
  lf_queue<ll_el<unsigned_int,_unsigned_int>_>::~lf_queue(in_stack_fffffffffffff590);
  hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::~hf_queue
            ((hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *)
             in_stack_fffffffffffff590);
  text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::~text_positions
            ((text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_> *)
             in_stack_fffffffffffff590);
  skippable_text<unsigned_int,_unsigned_int>::~skippable_text
            ((skippable_text<unsigned_int,_unsigned_int> *)in_stack_fffffffffffff590);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0));
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void compute_repair(string in){


	//packed_gamma_file2<> out_file(out);
	//packed_gamma_file2<> out_file(out);

	/*
	 * tradeoff between low-frequency and high-freq phase:
	 *
	 * - High-freq phase will use n^(2 - 2*alpha) words of memory and process approximately n^(1-alpha) pairs
	 *   alpha should satisfy 0.5 < alpha < 1
	 *
	 * - Low-freq phase will use n^alpha words of memory
	 *
	 */
	double alpha = 0.66; // = 2/3

	/*
	 * in the low-frequency pair processing phase, insert at most n/B elements in the hash
	 */
	uint64_t B = 50;

	itype n;
	itype sigma = 0; //alphabet size

	/*
	 * Pairs with frequency greater than or equal to min_high_frequency are inserted in high-freq queue
	 */
	itype min_high_frequency = 0;
	itype lf_queue_capacity = 0;

	/*
	 * (1) INITIALIZE DATA STRUCTURES
	 */

	const itype null = ~itype(0);

	ifstream ifs(in);

	vector<itype> char_to_int(256,null);

	//count file size
	{
		ifstream file(in,ios::ate);
		n = file.tellg();
	}

	min_high_frequency = std::pow(  n, alpha  );// n^(alpha)

	min_high_frequency = min_high_frequency <2 ? 2 : min_high_frequency;

	cout << "File size = " << n << " characters"  << endl;
	cout << "cut-off frequency = " << min_high_frequency  << endl;

	itype width = 64 - __builtin_clzll(uint64_t(n));

	//largest possible high-frequency dictionary symbol
	//at most max_d <= n high-freq dictionary symbols can be created; given that min. freq of
	//a high-freq dictionary symbol is f=min_high_frequency and that every new dictionary symbol
	//introduces a blank in the text, we have the inequality max_d * f <= n  <=> max_d <= n/f
	itype max_d = 256+n/min_high_frequency;

	//cout << "Max high-frequency dictionary symbol = " << max_d << endl << endl;

	//initialize text and text positions
	text_t T(n);

	itype j = 0;

	cout << "filling skippable text with text characters ... " << flush;

	char c;

	while(ifs.get(c)){

		if(char_to_int[uint8_t(c)] == null){

			char_to_int[uint8_t(c)] = sigma;
			A.push_back(uint8_t(c));
			sigma++;

		}

		T.set(j++,char_to_int[uint8_t(c)]);

	}

	cout << "done. " << endl << endl;

	cout << "alphabet size is " << sigma  << endl << endl;

	cout << "initializing and sorting text positions vector ... " << flush;

	TP_t TP(&T,min_high_frequency);

	cout << "done. Number of text positions containing a high-frequency pair: " << TP.size() << endl;

	//next free dictionary symbol = sigma
	X =  sigma;

	cout << "\nSTEP 1. HIGH FREQUENCY PAIRS" << endl << endl;

	cout << "inserting pairs in high-frequency queue ... " << flush;

	hf_q_t HFQ;
	new_high_frequency_queue(HFQ, TP, T, min_high_frequency);

	cout << "done. Number of distinct high-frequency pairs = " << HFQ.size() << endl;

	cout << "Replacing high-frequency pairs ... " << endl;

	int last_perc = -1;
	uint64_t F = 0;//largest freq

	while(HFQ.max() != HFQ.nullpair()){

		auto f = substitution_round<hf_q_t>(HFQ, TP, T);

		if(last_perc == -1){

			F = f;

			last_perc = 0;

		}else{

			int perc = 100-(100*f)/F;

			if(perc > last_perc+4){

				last_perc = perc;
				cout << perc << "%" << endl;

			}

		}

	}

	cout << "done. " << endl;
	cout << "Peak queue size = " << HFQ.peak() << " (" << double(HFQ.peak())/double(n) << "n)" << endl;

	cout << "\nSTEP 2. LOW FREQUENCY PAIRS" << endl << endl;

	cout << "Re-computing TP array ... " << flush;

	//T.compact(); //remove blank positions
	TP.fill_with_text_positions(); //store here all remaining text positions

	cout << "done." << endl;

	cout << "Sorting  TP array ... " << flush;
	TP.cluster(); //cluster text positions by character pairs
	cout << "done." << endl;


	cout << "Counting low-frequency pairs ... " << flush;
	/*
	 * scan sorted array of text positions and count frequencies
	 *
	 * in this phase, all pairs have frequency < min_high_frequency
	 *
	 * after counting, frequencies[f] is the number of pairs with frequency equal to f
	 *
	 */
	//auto frequencies = vector<uint64_t>(min_high_frequency,0);
	uint64_t n_lf_pairs = 0; //number of low-frequency pairs

	uint64_t f = 1;
	for(uint64_t i=1;i<TP.size();++i){

		if(T.pair_starting_at(TP[i]) == T.pair_starting_at(TP[i-1])){

			f++;

		}else{

			f=1;
			n_lf_pairs++;

		}

	}
	cout << "done. Number of distict low-frequency pairs: "<< n_lf_pairs << endl;

	cout << "Filling low-frequency queue ... " << flush;

	lf_q_t LFQ(min_high_frequency-1);

	f = 1;

	using el_t = lf_q_t::el_type;

	for(uint64_t i=1;i<TP.size();++i){

		if(T.pair_starting_at(TP[i]) == T.pair_starting_at(TP[i-1])){

			f++;

		}else{

			if(f>1){

				cpair ab = T.pair_starting_at(TP[i-1]);

				assert(i>=f);
				itype P_ab = i - f;

				itype L_ab = f;

				itype F_ab = f;

				el_t el = {ab,P_ab,L_ab,F_ab};

				LFQ.insert(el);

			}

			f=1;

		}

	}

	cout << "done." << endl;

	cout << "Replacing low-frequency pairs ... " << endl;

	pair<itype,itype> replaced = {0,0};

	last_perc = -1;
	uint64_t tl = T.number_of_non_blank_characters();

	while(LFQ.max() != LFQ.nullpair()){

		auto f = substitution_round<lf_q_t>(LFQ, TP, T);

		int perc = 100-(100*T.number_of_non_blank_characters())/tl;

		if(perc>last_perc+4){

			last_perc = perc;

			cout << perc << "%" << endl;

		}

	}

	cout << "done. " << endl;
	cout << "Peak queue size = " << LFQ.peak() << " (" << double(LFQ.peak())/double(n) << "n)" << endl;

	cout << "Compressing grammar and storing it to file ... " << endl << endl;

	for(itype i=0;i<T.size();++i){

		if(not T.is_blank(i)) T_vec.push_back(T[i]);

	}

}